

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O1

bool glslang::TDefaultIoResolverBase::isImageType(TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*type->_vptr_TType[7])();
  if (iVar1 == 0xe) {
    iVar1 = (*type->_vptr_TType[8])(type);
    if ((*(uint *)CONCAT44(extraout_var,iVar1) >> 0x13 & 1) != 0) {
      return ((*(uint *)CONCAT44(extraout_var,iVar1) & 0xff00) - 0x700 & 0xfffffe00) != 0;
    }
  }
  return false;
}

Assistant:

static bool isImageType(const glslang::TType& type) {
        return type.getBasicType() == glslang::EbtSampler && type.getSampler().isImage();
    }